

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_clock.c
# Opt level: O0

int oonf_clock_update(void)

{
  oonf_log_source source;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  uint64_t local_30;
  uint64_t now;
  uint64_t *local_20;
  undefined4 local_18;
  oonf_log_source local_14;
  uint8_t *local_10;
  
  local_20 = &local_30;
  iVar1 = os_clock_linux_gettime64(local_20);
  source = _oonf_clock_subsystem.logging;
  if (iVar1 == 0) {
    now_times = local_30 - start_time;
    now._4_4_ = 0;
  }
  else {
    local_10 = log_global_mask;
    local_14 = _oonf_clock_subsystem.logging;
    local_18 = 4;
    if ((log_global_mask[_oonf_clock_subsystem.logging] & 4) != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      piVar2 = __errno_location();
      oonf_log(LOG_SEVERITY_WARN,source,"src/base/oonf_clock.c",0x70,(void *)0x0,0,
               "OS clock is not working: %s (%d)\n",pcVar3,*piVar2);
    }
    now._4_4_ = -1;
  }
  return now._4_4_;
}

Assistant:

int
oonf_clock_update(void) {
  uint64_t now;
  if (os_clock_gettime64(&now)) {
    OONF_WARN(LOG_CLOCK, "OS clock is not working: %s (%d)\n", strerror(errno), errno);
    return -1;
  }

  now_times = now - start_time;
  return 0;
}